

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomExternalWrapperObject.cpp
# Opt level: O3

void * __thiscall Js::CustomExternalWrapperObject::GetSlotData(CustomExternalWrapperObject *this)

{
  Type TVar1;
  Type local_20;
  
  if (this->slotType == External) {
    TVar1 = this->u;
    Memory::Recycler::WBSetBit((char *)&local_20.inlineSlotSize);
    local_20 = TVar1;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_20);
    return (void *)local_20;
  }
  return this + 1;
}

Assistant:

void * CustomExternalWrapperObject::GetSlotData() const
{
    return this->slotType == SlotType::External
        ? unsafe_write_barrier_cast<void *>(this->u.slot)
        : GetInlineSlots();
}